

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
WriteFunc<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
          (ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
                 e)

{
  BasicStringRef<char> value;
  char *in_RSI;
  BasicWriter<char> *in_RDI;
  size_t unaff_retaddr;
  Buffer<char> *s;
  undefined4 in_stack_ffffffffffffffe0;
  Kind in_stack_ffffffffffffffe4;
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
  *in_stack_ffffffffffffffe8;
  ExprBase e_00;
  
  s = in_RDI->buffer_;
  e_00.impl_ = (Impl *)in_RDI;
  internal::ExprBase::kind((ExprBase *)0x18081a);
  mp::expr::str(in_stack_ffffffffffffffe4);
  fmt::BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)in_RDI,(char *)s);
  value.size_ = unaff_retaddr;
  value.data_ = in_RSI;
  fmt::BasicWriter<char>::operator<<((BasicWriter<char> *)e_00.impl_,value);
  WriteArgs<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
            (in_stack_ffffffffffffffe8,
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
              )e_00.impl_,(char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (int)((ulong)in_RSI >> 0x20));
  return;
}

Assistant:

void WriteFunc(Expr e) {
    writer_ << str(e.kind());
    WriteArgs(e);
  }